

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O2

void Mio_UpdateGenlib(Mio_Library_t *pLib)

{
  void *pvVar1;
  Map_SuperLib_t *p;
  Mio_Library_t *pLib_00;
  Amap_Lib_t *p_00;
  
  pvVar1 = Abc_FrameReadLibSuper();
  if (pvVar1 != (void *)0x0) {
    p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
    Map_SuperLibFree(p);
    Abc_FrameSetLibSuper((void *)0x0);
  }
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  Mio_LibraryDelete(pLib_00);
  Abc_FrameSetLibGen(pLib);
  p_00 = (Amap_Lib_t *)Abc_FrameReadLibGen2();
  Amap_LibFree(p_00);
  Abc_FrameSetLibGen2((void *)0x0);
  return;
}

Assistant:

void Mio_UpdateGenlib( Mio_Library_t * pLib )
{
    // free the current superlib because it depends on the old Mio library
    if ( Abc_FrameReadLibSuper() )
    {
        Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
        Abc_FrameSetLibSuper( NULL );
    }

    // replace the current library
    Mio_LibraryDelete( (Mio_Library_t *)Abc_FrameReadLibGen() );
    Abc_FrameSetLibGen( pLib );

    // replace the current library
    Amap_LibFree( (Amap_Lib_t *)Abc_FrameReadLibGen2() );
    Abc_FrameSetLibGen2( NULL );
}